

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.c
# Opt level: O0

void run_in_store(wasm_store_t *store)

{
  FILE *__stream;
  size_t sVar1;
  long lVar2;
  long lVar3;
  void *data;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  int i;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store_local;
  
  printf("Loading binary...\n");
  __stream = fopen("finalize.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fseek(__stream,0,2);
  binary.data = (wasm_byte_t *)ftell(__stream);
  fseek(__stream,0,0);
  wasm_byte_vec_new_uninitialized(&module,binary.data);
  sVar1 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
  if (sVar1 != 1) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fclose(__stream);
  printf("Compiling module...\n");
  lVar2 = wasm_module_new(store);
  if (lVar2 == 0) {
    printf("> Error compiling module!\n");
    exit(1);
  }
  wasm_byte_vec_delete(&module);
  printf("Instantiating modules...\n");
  imports.data._4_4_ = 0;
  while( true ) {
    if (100000 < (int)imports.data._4_4_) {
      wasm_module_delete(lVar2);
      return;
    }
    if ((int)imports.data._4_4_ % 10000 == 0) {
      printf("%d\n");
    }
    memset(&instance,0,0x10);
    lVar3 = wasm_instance_new(store,lVar2,&instance,0);
    if (lVar3 == 0) break;
    wasm_instance_set_host_info_with_finalizer(lVar3,(long)(int)imports.data._4_4_,finalize);
    wasm_instance_delete(lVar3);
    live_count = live_count + 1;
    imports.data._4_4_ = imports.data._4_4_ + 1;
  }
  printf("> Error instantiating module %d!\n",(ulong)imports.data._4_4_);
  exit(1);
}

Assistant:

void run_in_store(wasm_store_t* store) {
  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("finalize.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    exit(1);
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating modules...\n");
  for (int i = 0; i <= iterations; ++i) {
    if (i % (iterations / 10) == 0) printf("%d\n", i);
    wasm_extern_vec_t imports = WASM_EMPTY_VEC;
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, &imports, NULL);
    if (!instance) {
      printf("> Error instantiating module %d!\n", i);
      exit(1);
    }
    void* data = (void*)(intptr_t)i;
    wasm_instance_set_host_info_with_finalizer(instance, data, &finalize);
    wasm_instance_delete(instance);
    ++live_count;
  }

  wasm_module_delete(module);
}